

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gomory-hu-tree.c
# Opt level: O0

NodePair make_random_node_pair(int32_t n)

{
  NodePair NVar1;
  int iVar2;
  int iStack_10;
  int32_t n_local;
  NodePair result;
  
  memset(&iStack_10,0,8);
  iStack_10 = rand();
  iStack_10 = iStack_10 % n;
  do {
    iVar2 = rand();
    n_local = iVar2 % n;
  } while (n_local == iStack_10);
  NVar1.v = n_local;
  NVar1.u = iStack_10;
  return NVar1;
}

Assistant:

static NodePair make_random_node_pair(int32_t n) {
    NodePair result = {0};
    result.u = rand() % n;

    do {
        result.v = rand() % n;
    } while (result.v == result.u);

    return result;
}